

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O3

void lest::report(ostream *os,message *e,text *test)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  ostream *poVar3;
  char *pcVar4;
  allocator local_119;
  undefined1 *local_118;
  long local_110;
  undefined1 local_108 [16];
  undefined1 *local_f8;
  long local_f0;
  undefined1 local_e8 [16];
  char *local_d8;
  long local_d0;
  char local_c8 [16];
  char *local_b8;
  long local_b0;
  char local_a8 [16];
  char *local_98;
  long local_90;
  char local_88 [16];
  int local_78;
  undefined1 *local_70;
  long local_68;
  undefined1 local_60 [16];
  comment local_50;
  
  local_98 = local_88;
  pcVar2 = (e->where).file._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_98,pcVar2,pcVar2 + (e->where).file._M_string_length);
  local_78 = (e->where).line;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(os,local_98,local_90);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,local_78);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,": ",2);
  local_118 = local_108;
  pcVar2 = (e->kind)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_118,pcVar2,pcVar2 + (e->kind)._M_string_length);
  local_b8 = local_a8;
  std::__cxx11::string::_M_construct<char*>((string *)&local_b8,local_118,local_118 + local_110);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_b8,local_b0);
  paVar1 = &local_50.info.field_2;
  pcVar2 = (e->note).info._M_dataplus._M_p;
  local_50.info._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar2,pcVar2 + (e->note).info._M_string_length);
  poVar3 = operator<<(poVar3,&local_50);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,": ",2);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(test->_M_dataplus)._M_p,test->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,": ",2);
  pcVar4 = (char *)(**(code **)(*(long *)e + 0x10))(e);
  std::__cxx11::string::string((string *)&local_70,pcVar4,&local_119);
  local_f8 = local_e8;
  std::__cxx11::string::_M_construct<char*>((string *)&local_f8,local_70,local_70 + local_68);
  local_d8 = local_c8;
  std::__cxx11::string::_M_construct<char*>((string *)&local_d8,local_f8,local_f8 + local_f0);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_d8,local_d0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if (local_d8 != local_c8) {
    operator_delete(local_d8);
  }
  if (local_f8 != local_e8) {
    operator_delete(local_f8);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.info._M_dataplus._M_p != paVar1) {
    operator_delete(local_50.info._M_dataplus._M_p);
  }
  if (local_b8 != local_a8) {
    operator_delete(local_b8);
  }
  if (local_118 != local_108) {
    operator_delete(local_118);
  }
  if (local_98 != local_88) {
    operator_delete(local_98);
  }
  return;
}

Assistant:

inline void report( std::ostream & os, message const & e, text test )
{
    os << e.where << ": " << colourise( e.kind ) << e.note << ": " << test << ": " << colourise( e.what() ) << std::endl;
}